

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

size_t __thiscall slang::SourceManager::getLineNumber(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  SourceLocation location_00;
  size_t rawLineNumber;
  LineDirectiveInfo *pLVar2;
  FileInfo *this_00;
  uint uVar3;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = &this->mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  location_00 = getFullyExpandedLocImpl<std::shared_lock<std::shared_mutex>_>
                          (this,location,&local_28);
  rawLineNumber = getRawLineNumber<std::shared_lock<std::shared_mutex>_>(this,location_00,&local_28)
  ;
  if (rawLineNumber == 0) {
    rawLineNumber = 0;
  }
  else {
    uVar3 = location_00._0_4_ & 0xfffffff;
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (FileInfo *)0x0;
    if (*(__index_type *)
         ((long)&pvVar1[uVar3].
                 super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
         + 0x38) == '\0') {
      this_00 = (FileInfo *)(pvVar1 + uVar3);
    }
    pLVar2 = FileInfo::getPreviousLineDirective(this_00,rawLineNumber);
    if (pLVar2 != (LineDirectiveInfo *)0x0) {
      rawLineNumber = rawLineNumber + pLVar2->lineOfDirective + ~pLVar2->lineInFile;
    }
  }
  if (local_28._M_owns == true) {
    pthread_rwlock_unlock((pthread_rwlock_t *)local_28._M_pm);
  }
  return rawLineNumber;
}

Assistant:

size_t SourceManager::getLineNumber(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    SourceLocation fileLocation = getFullyExpandedLocImpl(location, lock);
    size_t rawLineNumber = getRawLineNumber(fileLocation, lock);
    if (rawLineNumber == 0)
        return 0;

    auto info = getFileInfo(fileLocation.buffer(), lock);

    auto lineDirective = info->getPreviousLineDirective(rawLineNumber);
    if (!lineDirective)
        return rawLineNumber;
    else
        return lineDirective->lineOfDirective + (rawLineNumber - lineDirective->lineInFile) - 1;
}